

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O0

bool __thiscall re2::BitState::ShouldVisit(BitState *this,int id,char *p)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  size_type sVar4;
  const_pointer pcVar5;
  unsigned_long *puVar6;
  bool bVar7;
  int n;
  char *p_local;
  int id_local;
  BitState *this_local;
  
  puVar3 = Prog::list_heads(this->prog_);
  uVar1 = puVar3[id];
  sVar4 = StringPiece::size(&this->text_);
  pcVar5 = StringPiece::data(&this->text_);
  iVar2 = (uint)uVar1 * ((int)sVar4 + 1) + ((int)p - (int)pcVar5);
  puVar6 = PODArray<unsigned_long>::operator[](&this->visited_,iVar2 / 0x40);
  bVar7 = (*puVar6 & 1L << ((byte)iVar2 & 0x3f)) == 0;
  if (bVar7) {
    puVar6 = PODArray<unsigned_long>::operator[](&this->visited_,iVar2 / 0x40);
    *puVar6 = 1L << ((byte)iVar2 & 0x3f) | *puVar6;
  }
  return bVar7;
}

Assistant:

bool BitState::ShouldVisit(int id, const char* p) {
  int n = prog_->list_heads()[id] * static_cast<int>(text_.size()+1) +
          static_cast<int>(p-text_.data());
  if (visited_[n/kVisitedBits] & (uint64_t{1} << (n & (kVisitedBits-1))))
    return false;
  visited_[n/kVisitedBits] |= uint64_t{1} << (n & (kVisitedBits-1));
  return true;
}